

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ld.h
# Opt level: O0

int __thiscall LdSketchWrapper<4U>::Query(LdSketchWrapper<4U> *this,Data<4U> *data,HashMap<4U> *mp)

{
  mapped_type mVar1;
  longlong lVar2;
  mapped_type *pmVar3;
  uchar *in_RDX;
  LDSketch_t *in_RSI;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_RDI;
  uchar *key;
  undefined4 in_stack_ffffffffffffffc8;
  
  lVar2 = LDSketch_up_estimate(in_RSI,in_RDX);
  mVar1 = (mapped_type)lVar2;
  pmVar3 = std::
           unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
           ::operator[](in_RDI,(key_type *)CONCAT44(mVar1,in_stack_ffffffffffffffc8));
  *pmVar3 = mVar1;
  lVar2 = LDSketch_low_estimate(in_RSI,in_RDX);
  pmVar3 = std::
           unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
           ::operator[](in_RDI,(key_type *)CONCAT44(mVar1,in_stack_ffffffffffffffc8));
  *pmVar3 = (mapped_type)lVar2;
  return 0;
}

Assistant:

int Query(const Data<DATA_LEN>& data, HashMap<DATA_LEN>& mp) {
		// estimate the frequency of data and store the estimations in mp
		unsigned char* key = (unsigned char*)(&(data.str[0]));
		mp[up_key] = LDSketch_up_estimate(summary, key);
		mp[low_key] = LDSketch_low_estimate(summary, key);
		return 0;
	}